

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * luaG_addinfo(lua_State *L,char *msg,TString *src,int line)

{
  char *pcVar1;
  char **local_80;
  char *id;
  size_t idlen;
  char buff [60];
  int line_local;
  TString *src_local;
  char *msg_local;
  lua_State *L_local;
  
  if (src == (TString *)0x0) {
    idlen._0_1_ = 0x3f;
    idlen._1_1_ = 0;
  }
  else {
    if (src->shrlen < '\0') {
      id = (char *)(src->u).hnext;
      local_80 = (char **)src->contents;
    }
    else {
      id = (char *)(long)src->shrlen;
      local_80 = &src->contents;
    }
    luaO_chunkid((char *)&idlen,(char *)local_80,(size_t)id);
  }
  pcVar1 = luaO_pushfstring(L,"%s:%d: %s",&idlen,(ulong)(uint)line,msg);
  return pcVar1;
}

Assistant:

const char *luaG_addinfo (lua_State *L, const char *msg, TString *src,
                                        int line) {
  char buff[LUA_IDSIZE];
  if (src) {
    size_t idlen;
    const char *id = getlstr(src, idlen);
    luaO_chunkid(buff, id, idlen);
  }
  else {  /* no source available; use "?" instead */
    buff[0] = '?'; buff[1] = '\0';
  }
  return luaO_pushfstring(L, "%s:%d: %s", buff, line, msg);
}